

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

Error __thiscall
asmjit::StringBuilder::_opNumber
          (StringBuilder *this,uint32_t op,uint64_t i,uint32_t base,size_t width,uint32_t flags)

{
  Error EVar1;
  char *__dest;
  char cVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  size_t __n;
  ulong uVar6;
  uint64_t uVar7;
  char *__src;
  long lVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  long lStack_d0;
  char buf [128];
  char local_38 [8];
  
  uVar5 = 10;
  if (0xffffffdc < base - 0x25) {
    uVar5 = base;
  }
  if ((long)i < 0 && (int)flags < 0) {
    cVar2 = '-';
    bVar11 = false;
    uVar7 = -i;
  }
  else {
    uVar7 = i;
    if ((flags & 1) == 0) {
      bVar11 = (flags & 2) == 0;
      cVar2 = (char)(flags & 2) << 4;
    }
    else {
      cVar2 = '+';
      bVar11 = false;
    }
  }
  uVar6 = (ulong)uVar5;
  uVar4 = 0;
  lVar9 = 0;
  do {
    lVar8 = lVar9;
    uVar4 = uVar4 + 1;
    buf[lVar8 + 0x7f] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar7 % uVar6];
    lVar9 = lVar8 + -1;
    bVar10 = uVar6 <= uVar7;
    uVar7 = uVar7 / uVar6;
  } while (bVar10);
  __src = buf + lVar8 + 0x7f;
  if ((flags & 4) != 0) {
    if (i == 0 || uVar5 != 8) {
      if (uVar5 != 0x10) goto LAB_00152f27;
      buf[lVar8 + 0x7e] = 'x';
      lStack_d0 = -3;
    }
    else {
      lStack_d0 = -2;
    }
    __src = local_38 + lVar8 + lStack_d0;
    *__src = '0';
  }
LAB_00152f27:
  if (!bVar11) {
    __src[-1] = cVar2;
    __src = __src + -1;
  }
  uVar6 = 0x100;
  if (width < 0x100) {
    uVar6 = width;
  }
  __n = uVar6 + lVar9;
  if (uVar6 < (ulong)-lVar9) {
    __n = 0;
  }
  sVar3 = uVar6 - uVar4;
  if (uVar6 < uVar4) {
    sVar3 = 0;
  }
  __dest = prepare(this,op,(size_t)(local_38 + sVar3 + -(long)__src));
  if (__dest == (char *)0x0) {
    EVar1 = 1;
  }
  else {
    memcpy(__dest,__src,(size_t)(buf + lVar9 + -(long)__src + 0x80));
    memset(__dest + (long)(buf + (lVar9 - (long)__src) + 0x80),0x30,__n);
    if (width < uVar4) {
      uVar4 = width;
    }
    if (0xff < uVar4) {
      uVar4 = 0x100;
    }
    memcpy(__dest + (long)(buf + (uVar6 - uVar4) + (lVar9 - (long)__src) + 0x80),buf + lVar8 + 0x7f,
           -lVar9);
    EVar1 = 0;
  }
  return EVar1;
}

Assistant:

Error StringBuilder::_opNumber(uint32_t op, uint64_t i, uint32_t base, size_t width, uint32_t flags) noexcept {
  if (base < 2 || base > 36)
    base = 10;

  char buf[128];
  char* p = buf + ASMJIT_ARRAY_SIZE(buf);

  uint64_t orig = i;
  char sign = '\0';

  // --------------------------------------------------------------------------
  // [Sign]
  // --------------------------------------------------------------------------

  if ((flags & kStringFormatSigned) != 0 && static_cast<int64_t>(i) < 0) {
    i = static_cast<uint64_t>(-static_cast<int64_t>(i));
    sign = '-';
  }
  else if ((flags & kStringFormatShowSign) != 0) {
    sign = '+';
  }
  else if ((flags & kStringFormatShowSpace) != 0) {
    sign = ' ';
  }

  // --------------------------------------------------------------------------
  // [Number]
  // --------------------------------------------------------------------------

  do {
    uint64_t d = i / base;
    uint64_t r = i % base;

    *--p = StringBuilder_numbers[r];
    i = d;
  } while (i);

  size_t numberLength = (size_t)(buf + ASMJIT_ARRAY_SIZE(buf) - p);

  // --------------------------------------------------------------------------
  // [Alternate Form]
  // --------------------------------------------------------------------------

  if ((flags & kStringFormatAlternate) != 0) {
    if (base == 8) {
      if (orig != 0)
        *--p = '0';
    }
    if (base == 16) {
      *--p = 'x';
      *--p = '0';
    }
  }

  // --------------------------------------------------------------------------
  // [Width]
  // --------------------------------------------------------------------------

  if (sign != 0)
    *--p = sign;

  if (width > 256)
    width = 256;

  if (width <= numberLength)
    width = 0;
  else
    width -= numberLength;

  // --------------------------------------------------------------------------
  // Write]
  // --------------------------------------------------------------------------

  size_t prefixLength = (size_t)(buf + ASMJIT_ARRAY_SIZE(buf) - p) - numberLength;
  char* data = prepare(op, prefixLength + width + numberLength);

  if (!data)
    return DebugUtils::errored(kErrorNoHeapMemory);

  ::memcpy(data, p, prefixLength);
  data += prefixLength;

  ::memset(data, '0', width);
  data += width;

  ::memcpy(data, p + prefixLength, numberLength);
  return kErrorOk;
}